

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,ParentNameQuery *b)

{
  bool bVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_50;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_38;
  ParentNameQueryBase *local_20;
  ParentNameQuery *b_local;
  Symbol *a_local;
  SymbolByParentEq *this_local;
  
  local_20 = &b->super_ParentNameQueryBase;
  b_local = (ParentNameQuery *)a;
  a_local = (Symbol *)this;
  Symbol::parent_name_key(&local_38,a);
  anon_unknown_24::ParentNameQueryBase::parent_name_key(&local_50,local_20);
  bVar1 = std::operator==(&local_38,&local_50);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }